

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_genericmodel.cpp
# Opt level: O0

void __thiscall tst_GenericModel::removeRow(tst_GenericModel *this)

{
  uint uVar1;
  bool bVar2;
  byte bVar3;
  int iVar4;
  uint *puVar5;
  const_reference pQVar6;
  QModelIndex local_510;
  QModelIndex local_4f8;
  undefined1 local_4e0 [8];
  value_type args_3;
  qsizetype local_4c0;
  QSignalSpy *local_4b8;
  QSignalSpy *spy_5;
  QSignalSpy **__end1_5;
  QSignalSpy **__begin1_5;
  QSignalSpy *(*__range1_5) [2];
  QModelIndex local_480;
  QModelIndex local_468;
  QModelIndex local_450;
  undefined1 local_438 [8];
  value_type args_2;
  qsizetype local_418;
  QSignalSpy *local_410;
  QSignalSpy *spy_4;
  QSignalSpy **__end1_4;
  QSignalSpy **__begin1_4;
  QSignalSpy *(*__range1_4) [2];
  QModelIndex local_3d8;
  QModelIndex local_3c0;
  QModelIndex local_3a8;
  undefined1 local_390 [8];
  value_type args_1;
  qsizetype local_370;
  QSignalSpy *local_368;
  QSignalSpy *spy_3;
  QSignalSpy **__end1_3;
  QSignalSpy **__begin1_3;
  QSignalSpy *(*__range1_3) [2];
  QModelIndex local_330;
  QModelIndex local_318;
  QModelIndex local_300;
  undefined1 local_2e8 [8];
  value_type args;
  qsizetype local_2c8;
  QSignalSpy *local_2c0;
  QSignalSpy *spy_2;
  QSignalSpy **__end1_2;
  QSignalSpy **__begin1_2;
  QSignalSpy *(*__range1_2) [2];
  QModelIndex local_288;
  qint32 local_26c;
  qsizetype local_268;
  QSignalSpy *local_260;
  QSignalSpy *spy_1;
  QSignalSpy **__end1_1;
  QSignalSpy **__begin1_1;
  QSignalSpy *(*__range1_1) [2];
  QModelIndex local_228;
  qint32 local_20c;
  qsizetype local_208;
  QSignalSpy *local_200;
  QSignalSpy *spy;
  QSignalSpy **__end1;
  QSignalSpy **__begin1;
  QSignalSpy *(*__range1) [2];
  QModelIndex local_1c8;
  QModelIndex local_1b0;
  QSignalSpy *local_198;
  QSignalSpy *spyArr [2];
  QSignalSpy rowsRemovedSpy;
  undefined1 local_100 [8];
  QSignalSpy rowsAboutToBeRemovedSpy;
  QModelIndex local_68;
  undefined1 local_40 [8];
  ModelTest probe;
  GenericModel testModel;
  int insertCol;
  tst_GenericModel *this_local;
  
  iVar4 = qMetaTypeId<int>();
  puVar5 = (uint *)QTest::qData("insertCol",iVar4);
  uVar1 = *puVar5;
  GenericModel::GenericModel((GenericModel *)&probe.field_0x8,(QObject *)0x0);
  ModelTest::ModelTest((ModelTest *)local_40,(QAbstractItemModel *)&probe.field_0x8,(QObject *)0x0);
  if (0 < (int)uVar1) {
    QModelIndex::QModelIndex(&local_68);
    GenericModel::insertColumns((int)&probe + 8,0,(QModelIndex *)(ulong)uVar1);
  }
  QModelIndex::QModelIndex((QModelIndex *)&rowsAboutToBeRemovedSpy.m_waiting);
  GenericModel::insertRows((int)&probe + 8,0,(QModelIndex *)0xd);
  QSignalSpy::QSignalSpy
            ((QSignalSpy *)local_100,(QObject *)&probe.field_0x8,
             "2rowsAboutToBeRemoved(QModelIndex, int, int)");
  bVar2 = QSignalSpy::isValid((QSignalSpy *)local_100);
  bVar3 = QTest::qVerify(bVar2,"rowsAboutToBeRemovedSpy.isValid()","",
                         "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                         ,0x1dc);
  if ((bVar3 & 1) != 0) {
    QSignalSpy::QSignalSpy
              ((QSignalSpy *)(spyArr + 1),(QObject *)&probe.field_0x8,
               "2rowsRemoved(QModelIndex, int, int)");
    bVar2 = QSignalSpy::isValid((QSignalSpy *)(spyArr + 1));
    bVar3 = QTest::qVerify(bVar2,"rowsRemovedSpy.isValid()","",
                           "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                           ,0x1de);
    if ((bVar3 & 1) != 0) {
      local_198 = (QSignalSpy *)local_100;
      spyArr[0] = (QSignalSpy *)(spyArr + 1);
      QModelIndex::QModelIndex(&local_1b0);
      iVar4 = GenericModel::rowCount((QModelIndex *)&probe.field_0x8);
      bVar3 = QTest::qCompare(iVar4,0xd,"testModel.rowCount()","13",
                              "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                              ,0x1e1);
      if (((bVar3 ^ 0xff) & 1) == 0) {
        QModelIndex::QModelIndex(&local_1c8);
        bVar2 = QAbstractItemModel::removeRow((QAbstractItemModel *)&probe.field_0x8,-1,&local_1c8);
        bVar3 = QTest::qVerify((bool)(~bVar2 & 1),"!testModel.removeRow(-1)","",
                               "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                               ,0x1e2);
        if (((bVar3 ^ 0xff) & 1) == 0) {
          QModelIndex::QModelIndex((QModelIndex *)&__range1);
          iVar4 = GenericModel::rowCount((QModelIndex *)&probe.field_0x8);
          bVar3 = QTest::qCompare(iVar4,0xd,"testModel.rowCount()","13",
                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                  ,0x1e3);
          if (((bVar3 ^ 0xff) & 1) == 0) {
            spy = (QSignalSpy *)(spyArr + 1);
            __end1 = &local_198;
            __begin1 = __end1;
            for (; (QSignalSpy *)__end1 != spy; __end1 = __end1 + 1) {
              local_200 = *__end1;
              local_208 = QList<QList<QVariant>_>::count(&local_200->super_QList<QList<QVariant>_>);
              local_20c = 0;
              bVar2 = QTest::qCompare<long_long,int>
                                (&local_208,&local_20c,"spy->count()","0",
                                 "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                 ,0x1e5);
              if (((bVar2 ^ 0xffU) & 1) != 0) goto LAB_00113982;
            }
            QModelIndex::QModelIndex(&local_228);
            bVar2 = QAbstractItemModel::removeRow
                              ((QAbstractItemModel *)&probe.field_0x8,0xd,&local_228);
            bVar3 = QTest::qVerify((bool)(~bVar2 & 1),"!testModel.removeRow(13)","",
                                   "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                   ,0x1e6);
            if (((bVar3 ^ 0xff) & 1) == 0) {
              QModelIndex::QModelIndex((QModelIndex *)&__range1_1);
              iVar4 = GenericModel::rowCount((QModelIndex *)&probe.field_0x8);
              bVar3 = QTest::qCompare(iVar4,0xd,"testModel.rowCount()","13",
                                      "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                      ,0x1e7);
              if (((bVar3 ^ 0xff) & 1) == 0) {
                spy_1 = (QSignalSpy *)(spyArr + 1);
                __end1_1 = &local_198;
                __begin1_1 = __end1_1;
                for (; (QSignalSpy *)__end1_1 != spy_1; __end1_1 = __end1_1 + 1) {
                  local_260 = *__end1_1;
                  local_268 = QList<QList<QVariant>_>::count
                                        (&local_260->super_QList<QList<QVariant>_>);
                  local_26c = 0;
                  bVar2 = QTest::qCompare<long_long,int>
                                    (&local_268,&local_26c,"spy->count()","0",
                                     "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                     ,0x1e9);
                  if (((bVar2 ^ 0xffU) & 1) != 0) goto LAB_00113982;
                }
                QModelIndex::QModelIndex(&local_288);
                bVar2 = QAbstractItemModel::removeRow
                                  ((QAbstractItemModel *)&probe.field_0x8,0,&local_288);
                bVar3 = QTest::qVerify(bVar2,"testModel.removeRow(0)","",
                                       "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                       ,0x1ea);
                if (((bVar3 ^ 0xff) & 1) == 0) {
                  QModelIndex::QModelIndex((QModelIndex *)&__range1_2);
                  iVar4 = GenericModel::rowCount((QModelIndex *)&probe.field_0x8);
                  bVar3 = QTest::qCompare(iVar4,0xc,"testModel.rowCount()","12",
                                          "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                          ,0x1eb);
                  if (((bVar3 ^ 0xff) & 1) == 0) {
                    spy_2 = (QSignalSpy *)(spyArr + 1);
                    __end1_2 = &local_198;
                    __begin1_2 = __end1_2;
                    for (; (QSignalSpy *)__end1_2 != spy_2; __end1_2 = __end1_2 + 1) {
                      local_2c0 = *__end1_2;
                      local_2c8 = QList<QList<QVariant>_>::count
                                            (&local_2c0->super_QList<QList<QVariant>_>);
                      args.d.size._4_4_ = 1;
                      bVar2 = QTest::qCompare<long_long,int>
                                        (&local_2c8,(qint32 *)((long)&args.d.size + 4),
                                         "spy->count()","1",
                                         "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                         ,0x1ed);
                      if (((bVar2 ^ 0xffU) & 1) != 0) goto LAB_00113982;
                      QList<QList<QVariant>_>::takeFirst
                                ((value_type *)local_2e8,&local_2c0->super_QList<QList<QVariant>_>);
                      pQVar6 = QList<QVariant>::at((QList<QVariant> *)local_2e8,2);
                      iVar4 = QVariant::toInt((bool *)pQVar6);
                      bVar3 = QTest::qCompare(iVar4,0,"args.at(2).toInt()","0",
                                              "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                              ,0x1ef);
                      if ((bVar3 & 1) == 0) {
                        bVar2 = true;
                      }
                      else {
                        pQVar6 = QList<QVariant>::at((QList<QVariant> *)local_2e8,1);
                        iVar4 = QVariant::toInt((bool *)pQVar6);
                        bVar3 = QTest::qCompare(iVar4,0,"args.at(1).toInt()","0",
                                                "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                ,0x1f0);
                        if ((bVar3 & 1) == 0) {
                          bVar2 = true;
                        }
                        else {
                          pQVar6 = QList<QVariant>::at((QList<QVariant> *)local_2e8,0);
                          QVariant::value<QModelIndex>(&local_300,pQVar6);
                          QModelIndex::QModelIndex(&local_318);
                          bVar2 = QTest::qCompare<QModelIndex,QModelIndex>
                                            (&local_300,&local_318,"args.at(0).value<QModelIndex>()"
                                             ,"QModelIndex()",
                                             "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                             ,0x1f1);
                          if (((bVar2 ^ 0xffU) & 1) == 0) {
                            bVar2 = false;
                          }
                          else {
                            bVar2 = true;
                          }
                        }
                      }
                      QList<QVariant>::~QList((QList<QVariant> *)local_2e8);
                      if (bVar2) goto LAB_00113982;
                    }
                    QModelIndex::QModelIndex(&local_330);
                    bVar2 = QAbstractItemModel::removeRow
                                      ((QAbstractItemModel *)&probe.field_0x8,0,&local_330);
                    bVar3 = QTest::qVerify(bVar2,"testModel.removeRow(0)","",
                                           "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                           ,499);
                    if (((bVar3 ^ 0xff) & 1) == 0) {
                      QModelIndex::QModelIndex((QModelIndex *)&__range1_3);
                      iVar4 = GenericModel::rowCount((QModelIndex *)&probe.field_0x8);
                      bVar3 = QTest::qCompare(iVar4,0xb,"testModel.rowCount()","11",
                                              "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                              ,500);
                      if (((bVar3 ^ 0xff) & 1) == 0) {
                        spy_3 = (QSignalSpy *)(spyArr + 1);
                        __end1_3 = &local_198;
                        __begin1_3 = __end1_3;
                        for (; (QSignalSpy *)__end1_3 != spy_3; __end1_3 = __end1_3 + 1) {
                          local_368 = *__end1_3;
                          local_370 = QList<QList<QVariant>_>::count
                                                (&local_368->super_QList<QList<QVariant>_>);
                          args_1.d.size._4_4_ = 1;
                          bVar2 = QTest::qCompare<long_long,int>
                                            (&local_370,(qint32 *)((long)&args_1.d.size + 4),
                                             "spy->count()","1",
                                             "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                             ,0x1f6);
                          if (((bVar2 ^ 0xffU) & 1) != 0) goto LAB_00113982;
                          QList<QList<QVariant>_>::takeFirst
                                    ((value_type *)local_390,
                                     &local_368->super_QList<QList<QVariant>_>);
                          pQVar6 = QList<QVariant>::at((QList<QVariant> *)local_390,2);
                          iVar4 = QVariant::toInt((bool *)pQVar6);
                          bVar3 = QTest::qCompare(iVar4,0,"args.at(2).toInt()","0",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x1f8);
                          if ((bVar3 & 1) == 0) {
                            bVar2 = true;
                          }
                          else {
                            pQVar6 = QList<QVariant>::at((QList<QVariant> *)local_390,1);
                            iVar4 = QVariant::toInt((bool *)pQVar6);
                            bVar3 = QTest::qCompare(iVar4,0,"args.at(1).toInt()","0",
                                                                                                        
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x1f9);
                            if ((bVar3 & 1) == 0) {
                              bVar2 = true;
                            }
                            else {
                              pQVar6 = QList<QVariant>::at((QList<QVariant> *)local_390,0);
                              QVariant::value<QModelIndex>(&local_3a8,pQVar6);
                              QModelIndex::QModelIndex(&local_3c0);
                              bVar2 = QTest::qCompare<QModelIndex,QModelIndex>
                                                (&local_3a8,&local_3c0,
                                                 "args.at(0).value<QModelIndex>()","QModelIndex()",
                                                 "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                 ,0x1fa);
                              if (((bVar2 ^ 0xffU) & 1) == 0) {
                                bVar2 = false;
                              }
                              else {
                                bVar2 = true;
                              }
                            }
                          }
                          QList<QVariant>::~QList((QList<QVariant> *)local_390);
                          if (bVar2) goto LAB_00113982;
                        }
                        QModelIndex::QModelIndex(&local_3d8);
                        bVar2 = QAbstractItemModel::removeRow
                                          ((QAbstractItemModel *)&probe.field_0x8,1,&local_3d8);
                        bVar3 = QTest::qVerify(bVar2,"testModel.removeRow(1)","",
                                               "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                               ,0x1fc);
                        if (((bVar3 ^ 0xff) & 1) == 0) {
                          QModelIndex::QModelIndex((QModelIndex *)&__range1_4);
                          iVar4 = GenericModel::rowCount((QModelIndex *)&probe.field_0x8);
                          bVar3 = QTest::qCompare(iVar4,10,"testModel.rowCount()","10",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x1fd);
                          if (((bVar3 ^ 0xff) & 1) == 0) {
                            spy_4 = (QSignalSpy *)(spyArr + 1);
                            __end1_4 = &local_198;
                            __begin1_4 = __end1_4;
                            for (; (QSignalSpy *)__end1_4 != spy_4; __end1_4 = __end1_4 + 1) {
                              local_410 = *__end1_4;
                              local_418 = QList<QList<QVariant>_>::count
                                                    (&local_410->super_QList<QList<QVariant>_>);
                              args_2.d.size._4_4_ = 1;
                              bVar2 = QTest::qCompare<long_long,int>
                                                (&local_418,(qint32 *)((long)&args_2.d.size + 4),
                                                 "spy->count()","1",
                                                 "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                 ,0x1ff);
                              if (((bVar2 ^ 0xffU) & 1) != 0) goto LAB_00113982;
                              QList<QList<QVariant>_>::takeFirst
                                        ((value_type *)local_438,
                                         &local_410->super_QList<QList<QVariant>_>);
                              pQVar6 = QList<QVariant>::at((QList<QVariant> *)local_438,2);
                              iVar4 = QVariant::toInt((bool *)pQVar6);
                              bVar3 = QTest::qCompare(iVar4,1,"args.at(2).toInt()","1",
                                                                                                            
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x201);
                              if ((bVar3 & 1) == 0) {
                                bVar2 = true;
                              }
                              else {
                                pQVar6 = QList<QVariant>::at((QList<QVariant> *)local_438,1);
                                iVar4 = QVariant::toInt((bool *)pQVar6);
                                bVar3 = QTest::qCompare(iVar4,1,"args.at(1).toInt()","1",
                                                                                                                
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x202);
                                if ((bVar3 & 1) == 0) {
                                  bVar2 = true;
                                }
                                else {
                                  pQVar6 = QList<QVariant>::at((QList<QVariant> *)local_438,0);
                                  QVariant::value<QModelIndex>(&local_450,pQVar6);
                                  QModelIndex::QModelIndex(&local_468);
                                  bVar2 = QTest::qCompare<QModelIndex,QModelIndex>
                                                    (&local_450,&local_468,
                                                     "args.at(0).value<QModelIndex>()",
                                                     "QModelIndex()",
                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x203);
                                  if (((bVar2 ^ 0xffU) & 1) == 0) {
                                    bVar2 = false;
                                  }
                                  else {
                                    bVar2 = true;
                                  }
                                }
                              }
                              QList<QVariant>::~QList((QList<QVariant> *)local_438);
                              if (bVar2) goto LAB_00113982;
                            }
                            QModelIndex::QModelIndex(&local_480);
                            bVar2 = QAbstractItemModel::removeRow
                                              ((QAbstractItemModel *)&probe.field_0x8,9,&local_480);
                            bVar3 = QTest::qVerify(bVar2,"testModel.removeRow(9)","",
                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x205);
                            if (((bVar3 ^ 0xff) & 1) == 0) {
                              QModelIndex::QModelIndex((QModelIndex *)&__range1_5);
                              iVar4 = GenericModel::rowCount((QModelIndex *)&probe.field_0x8);
                              bVar3 = QTest::qCompare(iVar4,9,"testModel.rowCount()","9",
                                                                                                            
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x206);
                              if (((bVar3 ^ 0xff) & 1) == 0) {
                                spy_5 = (QSignalSpy *)(spyArr + 1);
                                __end1_5 = &local_198;
                                __begin1_5 = __end1_5;
                                for (; (QSignalSpy *)__end1_5 != spy_5; __end1_5 = __end1_5 + 1) {
                                  local_4b8 = *__end1_5;
                                  local_4c0 = QList<QList<QVariant>_>::count
                                                        (&local_4b8->super_QList<QList<QVariant>_>);
                                  args_3.d.size._4_4_ = 1;
                                  bVar2 = QTest::qCompare<long_long,int>
                                                    (&local_4c0,(qint32 *)((long)&args_3.d.size + 4)
                                                     ,"spy->count()","1",
                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x208);
                                  if (((bVar2 ^ 0xffU) & 1) != 0) break;
                                  QList<QList<QVariant>_>::takeFirst
                                            ((value_type *)local_4e0,
                                             &local_4b8->super_QList<QList<QVariant>_>);
                                  pQVar6 = QList<QVariant>::at((QList<QVariant> *)local_4e0,2);
                                  iVar4 = QVariant::toInt((bool *)pQVar6);
                                  bVar3 = QTest::qCompare(iVar4,9,"args.at(2).toInt()","9",
                                                                                                                    
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x20a);
                                  if ((bVar3 & 1) == 0) {
                                    bVar2 = true;
                                  }
                                  else {
                                    pQVar6 = QList<QVariant>::at((QList<QVariant> *)local_4e0,1);
                                    iVar4 = QVariant::toInt((bool *)pQVar6);
                                    bVar3 = QTest::qCompare(iVar4,9,"args.at(1).toInt()","9",
                                                                                                                        
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x20b);
                                    if ((bVar3 & 1) == 0) {
                                      bVar2 = true;
                                    }
                                    else {
                                      pQVar6 = QList<QVariant>::at((QList<QVariant> *)local_4e0,0);
                                      QVariant::value<QModelIndex>(&local_4f8,pQVar6);
                                      QModelIndex::QModelIndex(&local_510);
                                      bVar2 = QTest::qCompare<QModelIndex,QModelIndex>
                                                        (&local_4f8,&local_510,
                                                         "args.at(0).value<QModelIndex>()",
                                                         "QModelIndex()",
                                                                                                                  
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x20c);
                                      if (((bVar2 ^ 0xffU) & 1) == 0) {
                                        bVar2 = false;
                                      }
                                      else {
                                        bVar2 = true;
                                      }
                                    }
                                  }
                                  QList<QVariant>::~QList((QList<QVariant> *)local_4e0);
                                  if (bVar2) break;
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
LAB_00113982:
    QSignalSpy::~QSignalSpy((QSignalSpy *)(spyArr + 1));
  }
  QSignalSpy::~QSignalSpy((QSignalSpy *)local_100);
  ModelTest::~ModelTest((ModelTest *)local_40);
  GenericModel::~GenericModel((GenericModel *)&probe.field_0x8);
  return;
}

Assistant:

void tst_GenericModel::removeRow()
{
    QFETCH(int, insertCol);
    GenericModel testModel;
    ModelTest probe(&testModel, nullptr);
    if (insertCol > 0)
        testModel.insertColumns(0, insertCol);
    testModel.insertRows(0, 13);
    QSignalSpy rowsAboutToBeRemovedSpy(&testModel, SIGNAL(rowsAboutToBeRemoved(QModelIndex, int, int)));
    QVERIFY(rowsAboutToBeRemovedSpy.isValid());
    QSignalSpy rowsRemovedSpy(&testModel, SIGNAL(rowsRemoved(QModelIndex, int, int)));
    QVERIFY(rowsRemovedSpy.isValid());
    QSignalSpy *const spyArr[] = {&rowsAboutToBeRemovedSpy, &rowsRemovedSpy};

    QCOMPARE(testModel.rowCount(), 13);
    QVERIFY(!testModel.removeRow(-1));
    QCOMPARE(testModel.rowCount(), 13);
    for (QSignalSpy *spy : spyArr)
        QCOMPARE(spy->count(), 0);
    QVERIFY(!testModel.removeRow(13));
    QCOMPARE(testModel.rowCount(), 13);
    for (QSignalSpy *spy : spyArr)
        QCOMPARE(spy->count(), 0);
    QVERIFY(testModel.removeRow(0));
    QCOMPARE(testModel.rowCount(), 12);
    for (QSignalSpy *spy : spyArr) {
        QCOMPARE(spy->count(), 1);
        const auto args = spy->takeFirst();
        QCOMPARE(args.at(2).toInt(), 0);
        QCOMPARE(args.at(1).toInt(), 0);
        QCOMPARE(args.at(0).value<QModelIndex>(), QModelIndex());
    }
    QVERIFY(testModel.removeRow(0));
    QCOMPARE(testModel.rowCount(), 11);
    for (QSignalSpy *spy : spyArr) {
        QCOMPARE(spy->count(), 1);
        const auto args = spy->takeFirst();
        QCOMPARE(args.at(2).toInt(), 0);
        QCOMPARE(args.at(1).toInt(), 0);
        QCOMPARE(args.at(0).value<QModelIndex>(), QModelIndex());
    }
    QVERIFY(testModel.removeRow(1));
    QCOMPARE(testModel.rowCount(), 10);
    for (QSignalSpy *spy : spyArr) {
        QCOMPARE(spy->count(), 1);
        const auto args = spy->takeFirst();
        QCOMPARE(args.at(2).toInt(), 1);
        QCOMPARE(args.at(1).toInt(), 1);
        QCOMPARE(args.at(0).value<QModelIndex>(), QModelIndex());
    }
    QVERIFY(testModel.removeRow(9));
    QCOMPARE(testModel.rowCount(), 9);
    for (QSignalSpy *spy : spyArr) {
        QCOMPARE(spy->count(), 1);
        const auto args = spy->takeFirst();
        QCOMPARE(args.at(2).toInt(), 9);
        QCOMPARE(args.at(1).toInt(), 9);
        QCOMPARE(args.at(0).value<QModelIndex>(), QModelIndex());
    }
}